

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall Server::_unknownCommandHandler(Server *this,Pointer *client,string *command)

{
  element_type *peVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Unknown command \"",0x11);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(command->_M_dataplus)._M_p,command->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" issued by ",0xc);
  peVar1 = client->px;
  if (peVar1 != (element_type *)0x0) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(peVar1->m_clientName)._M_dataplus._M_p,
                        (peVar1->m_clientName)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    return;
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<ClientConnection>::operator->() const [T = ClientConnection]"
               );
}

Assistant:

void _unknownCommandHandler( ClientConnection::Pointer client, const string& command ){
        cerr << "Unknown command \"" << command << "\" issued by " << client->getName() << endl;
    }